

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void share_xchannel_free(share_xchannel *xc)

{
  share_xchannel_message *ptr;
  share_xchannel_message *tmp;
  share_xchannel *xc_local;
  
  while (xc->msghead != (share_xchannel_message *)0x0) {
    ptr = xc->msghead;
    xc->msghead = ptr->next;
    safefree(ptr);
  }
  safefree(xc);
  return;
}

Assistant:

static void share_xchannel_free(struct share_xchannel *xc)
{
    while (xc->msghead) {
        struct share_xchannel_message *tmp = xc->msghead;
        xc->msghead = tmp->next;
        sfree(tmp);
    }
    sfree(xc);
}